

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

string * __thiscall ArrayType::surroundName(ArrayType *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long in_RSI;
  string *in_RDI;
  uint i;
  string ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  string local_c8 [32];
  string local_a8 [16];
  ArrayType *in_stack_ffffffffffffff68;
  string local_88 [32];
  string local_68 [32];
  uint local_48;
  string local_38 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  __lhs = in_RDI;
  local_18 = in_RDX;
  std::__cxx11::string::string(local_38);
  if (((*(byte *)(in_RSI + 0x40) & 1) == 0) ||
     ((*(byte *)(*(long *)(in_RSI + 0x48) + 0x1c) & 1) == 0)) {
    sizeToString_abi_cxx11_(in_stack_ffffffffffffff68);
    std::operator+(__lhs,local_18);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  }
  else {
    std::__cxx11::string::operator=(local_38,"(");
    for (local_48 = 0; local_48 < *(uint *)(*(long *)(in_RSI + 0x48) + 0x18);
        local_48 = local_48 + 1) {
      std::__cxx11::string::operator+=(local_38,"*");
    }
    std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    sizeToString_abi_cxx11_(in_stack_ffffffffffffff68);
    std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffef0);
    std::operator+(__lhs,in_stack_fffffffffffffef0);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_a8);
  }
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string ArrayType::surroundName(const std::string& name) {
    std::string ret;
    if (isPointerArray && pointer->isArrayPointer) {
        ret = "(";
        for (unsigned i = 0; i < pointer->levels; i++) {
            ret += "*";
        }
        return ret + name + sizeToString() + ")" + pointer->sizes;
    } else {
        return name + sizeToString();
    }
}